

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O3

void __thiscall llvm::FoldingSetBase::InsertNode(FoldingSetBase *this,Node *N,void *InsertPos)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  FoldingSetNodeID TempID;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [128];
  
  if (N->NextInFoldingSetBucket == (void *)0x0) {
    uVar1 = this->NumNodes + 1;
    uVar2 = this->NumBuckets * 2;
    if (uVar2 < uVar1) {
      GrowBucketCount(this,uVar2);
      local_b0 = 0x2000000000;
      local_b8 = local_a8;
      uVar2 = (*this->_vptr_FoldingSetBase[3])(this,N,&local_b8);
      InsertPos = this->Buckets + (this->NumBuckets - 1 & uVar2);
      if (local_b8 != local_a8) {
        free(local_b8);
      }
      uVar1 = this->NumNodes + 1;
    }
    this->NumNodes = uVar1;
    pvVar3 = (void *)((ulong)InsertPos | 1);
    if (*InsertPos != (void *)0x0) {
      pvVar3 = *InsertPos;
    }
    N->NextInFoldingSetBucket = pvVar3;
    *(Node **)InsertPos = N;
    return;
  }
  __assert_fail("!N->getNextInBucket()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/FoldingSet.cpp"
                ,0x15c,"void llvm::FoldingSetBase::InsertNode(Node *, void *)");
}

Assistant:

void FoldingSetBase::InsertNode(Node *N, void *InsertPos) {
  assert(!N->getNextInBucket());
  // Do we need to grow the hashtable?
  if (NumNodes+1 > capacity()) {
    GrowHashTable();
    FoldingSetNodeID TempID;
    InsertPos = GetBucketFor(ComputeNodeHash(N, TempID), Buckets, NumBuckets);
  }

  ++NumNodes;

  /// The insert position is actually a bucket pointer.
  void **Bucket = static_cast<void**>(InsertPos);

  void *Next = *Bucket;

  // If this is the first insertion into this bucket, its next pointer will be
  // null.  Pretend as if it pointed to itself, setting the low bit to indicate
  // that it is a pointer to the bucket.
  if (!Next)
    Next = reinterpret_cast<void*>(reinterpret_cast<intptr_t>(Bucket)|1);

  // Set the node's next pointer, and make the bucket point to the node.
  N->SetNextInBucket(Next);
  *Bucket = N;
}